

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O0

int __thiscall DTSStreamReader::testSyncInfo16be(DTSStreamReader *this,uint8_t *p_buf)

{
  int test_lfe;
  uint test_bit_rate_index;
  uint test_sample_rate_index;
  int test_audio_mode;
  int frame_size;
  uint8_t *p_buf_local;
  DTSStreamReader *this_local;
  
  this->nblks = (p_buf[4] & 1) << 6 | (int)(uint)p_buf[5] >> 2;
  test_bit_rate_index = (p_buf[7] & 0xf) << 2 | (int)(uint)p_buf[8] >> 6;
  if (((int)(uint)p_buf[10] >> 1 & 3U) != 0) {
    test_bit_rate_index = test_bit_rate_index | 0x10000;
  }
  if (((test_bit_rate_index == this->pi_audio_mode) &&
      (((int)(uint)p_buf[8] >> 2 & 0xfU) == this->pi_sample_rate_index)) &&
     (((p_buf[8] & 3) << 3 | (int)(uint)p_buf[9] >> 5) == this->pi_bit_rate_index)) {
    this_local._4_4_ = ((p_buf[5] & 3) << 0xc | (uint)p_buf[6] << 4 | (int)(uint)p_buf[7] >> 4) + 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int DTSStreamReader::testSyncInfo16be(const uint8_t* p_buf)
{
    nblks = (p_buf[4] & 0x01) << 6 | p_buf[5] >> 2;
    const int frame_size = (p_buf[5] & 0x03) << 12 | p_buf[6] << 4 | p_buf[7] >> 4;
    int test_audio_mode = (p_buf[7] & 0x0f) << 2 | p_buf[8] >> 6;
    const unsigned test_sample_rate_index = (p_buf[8] >> 2) & 0x0f;
    const unsigned test_bit_rate_index = (p_buf[8] & 0x03) << 3 | ((p_buf[9] >> 5) & 0x07);
    const int test_lfe = (p_buf[10] >> 1) & 0x03;
    if (test_lfe)
        test_audio_mode |= 0x10000;
    if (test_audio_mode == pi_audio_mode && test_sample_rate_index == pi_sample_rate_index &&
        test_bit_rate_index == pi_bit_rate_index)
        return frame_size + 1;
    return 0;
}